

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editor.cpp
# Opt level: O2

int __thiscall
CEditor::DoButton_Editor_Common
          (CEditor *this,void *pID,char *pText,int Checked,CUIRect *pRect,int Flags,char *pToolTip)

{
  CUI *this_00;
  bool bVar1;
  int iVar2;
  
  this_00 = &this->m_UI;
  bVar1 = CUI::MouseInside(this_00,pRect);
  if (bVar1) {
    if ((Flags & 1U) != 0) {
      ms_pUiGotContext = pID;
    }
    if (this->m_pTooltip != (char *)0x0) {
      this->m_pTooltip = pToolTip;
    }
  }
  if ((pToolTip != (char *)0x0) && ((this->m_UI).m_pHotItem == pID)) {
    this->m_pTooltip = pToolTip;
  }
  bVar1 = CUI::DoButtonLogic(this_00,pID,pRect,0);
  if (bVar1) {
    iVar2 = 1;
  }
  else {
    bVar1 = CUI::DoButtonLogic(this_00,pID,pRect,1);
    iVar2 = (uint)bVar1 * 2;
  }
  return iVar2;
}

Assistant:

int CEditor::DoButton_Editor_Common(const void *pID, const char *pText, int Checked, const CUIRect *pRect, int Flags, const char *pToolTip)
{
	if(UI()->MouseInside(pRect))
	{
		if(Flags&BUTTON_CONTEXT)
			ms_pUiGotContext = pID;
		if(m_pTooltip)
			m_pTooltip = pToolTip;
	}

	if(UI()->HotItem() == pID && pToolTip)
		m_pTooltip = (const char *)pToolTip;

	if(UI()->DoButtonLogic(pID, pRect, 0))
		return 1;
	if(UI()->DoButtonLogic(pID, pRect, 1))
		return 2;
	return 0;
}